

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setDisplayFormat(QDateTimeEdit *this,QString *format)

{
  QString *this_00;
  uint uVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> QVar5;
  QTime time;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  long lVar10;
  QDate min;
  QDate max;
  int iVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QDateTime local_70 [8];
  QTime local_68;
  QTime local_64;
  QTime local_60;
  QTime local_5c;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  QVar12.m_data = (storage_type_conflict *)(format->d).size;
  QVar12.m_size = (qsizetype)(plVar2 + 0x7b);
  cVar3 = QDateTimeParser::parseFormat(QVar12);
  if (cVar3 != '\0') {
    QString::clear((QString *)(plVar2 + 0x98));
    bVar4 = QWidget::isRightToLeft((QWidget *)this);
    if (bVar4) {
      QString::operator=((QString *)(plVar2 + 0x98),(QString *)format);
      this_00 = (QString *)(plVar2 + 0x87);
      QString::clear(this_00);
      iVar11 = (int)plVar2[0x83];
      while (iVar11 = iVar11 + -1, -1 < iVar11) {
        QString::append((QString *)this_00);
        QDateTimeParser::sectionNode((int)(plVar2 + 0x7b));
        QDateTimeParser::SectionNode::format();
        QString::append((QString *)this_00);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      }
      QString::append((QString *)this_00);
      iVar7 = QList<QString>::begin((QList<QString> *)(plVar2 + 0x84));
      iVar8 = QList<QString>::end((QList<QString> *)(plVar2 + 0x84));
      std::__reverse<QList<QString>::iterator>(iVar7.i,iVar8.i);
      iVar9 = QList<QDateTimeParser::SectionNode>::begin
                        ((QList<QDateTimeParser::SectionNode> *)(plVar2 + 0x81));
      QList<QDateTimeParser::SectionNode>::end
                ((QList<QDateTimeParser::SectionNode> *)(plVar2 + 0x81));
      std::__reverse<QList<QDateTimeParser::SectionNode>::iterator>(iVar9.i);
    }
    *(undefined1 *)((long)plVar2 + 0x4f9) = 1;
    QVar5.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         QDateTimeEditPrivate::convertSections
                   ((QFlagsStorageHelper<QDateTimeParser::Section,_4>)
                    ((QFlagsStorageHelper<QDateTimeParser::Section,_4> *)(plVar2 + 0x7d))->
                    super_QFlagsStorage<QDateTimeParser::Section>);
    ((QFlagsStorageHelper<QDateTimeEdit::Section,_4> *)(plVar2 + 0x8e))->
    super_QFlagsStorage<QDateTimeEdit::Section> =
         QVar5.super_QFlagsStorage<QDateTimeEdit::Section>.i;
    (**(code **)(*plVar2 + 0xf8))(plVar2);
    lVar10 = plVar2[0x83] + -1;
    if ((long)(int)plVar2[0x7c] <= plVar2[0x83] + -1) {
      lVar10 = (long)(int)plVar2[0x7c];
    }
    *(int *)(plVar2 + 0x7c) = (int)lVar10;
    uVar1 = *(uint *)(plVar2 + 0x8e);
    if ((uVar1 & 0x700) == 0 && (uVar1 & 0x1f) != 0) {
      time.mds = ::QVariant::toTime();
      min.jd = ::QVariant::toDate();
      max.jd = ::QVariant::toDate();
      setDateRange(this,min,max);
      iVar11 = ::QVariant::toTime();
      iVar6 = ::QVariant::toTime();
      if (iVar6 <= iVar11) {
        QTime::QTime(&local_5c,0,0,0,0);
        QTime::QTime(&local_60,0x17,0x3b,0x3b,999);
        setTimeRange(this,local_5c,local_60);
        setTime(this,time);
      }
    }
    else if ((uVar1 & 0x1f) == 0 && (uVar1 & 0x700) != 0) {
      QTime::QTime(&local_64,0,0,0,0);
      QTime::QTime(&local_68,0x17,0x3b,0x3b,999);
      setTimeRange(this,local_64,local_68);
      ::QVariant::toDate();
      QDate::startOfDay((QTimeZone *)local_70);
      ::QVariant::QVariant(&local_58,local_70);
      ::QVariant::operator=((QVariant *)(plVar2 + 0x54),&local_58);
      ::QVariant::~QVariant(&local_58);
      QDateTime::~QDateTime(local_70);
    }
    (**(code **)(*plVar2 + 0xc0))(plVar2);
    (**(code **)(*plVar2 + 0xe8))(plVar2,0xffffffffffffffff,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDisplayFormat(const QString &format)
{
    Q_D(QDateTimeEdit);
    if (d->parseFormat(format)) {
        d->unreversedFormat.clear();
        if (isRightToLeft()) {
            d->unreversedFormat = format;
            d->displayFormat.clear();
            for (int i=d->sectionNodes.size() - 1; i>=0; --i) {
                d->displayFormat += d->separators.at(i + 1);
                d->displayFormat += d->sectionNode(i).format();
            }
            d->displayFormat += d->separators.at(0);
            std::reverse(d->separators.begin(), d->separators.end());
            std::reverse(d->sectionNodes.begin(), d->sectionNodes.end());
        }

        d->formatExplicitlySet = true;
        d->sections = QDateTimeEditPrivate::convertSections(d->display);
        d->clearCache();

        d->currentSectionIndex = qMin(d->currentSectionIndex, d->sectionNodes.size() - 1);
        const bool timeShown = (d->sections & TimeSections_Mask);
        const bool dateShown = (d->sections & DateSections_Mask);
        Q_ASSERT(dateShown || timeShown);
        if (timeShown && !dateShown) {
            QTime time = d->value.toTime();
            setDateRange(d->value.toDate(), d->value.toDate());
            if (d->minimum.toTime() >= d->maximum.toTime()) {
                setTimeRange(QDATETIMEEDIT_TIME_MIN, QDATETIMEEDIT_TIME_MAX);
                // if the time range became invalid during the adjustment, the time would have been reset
                setTime(time);
            }
        } else if (dateShown && !timeShown) {
            setTimeRange(QDATETIMEEDIT_TIME_MIN, QDATETIMEEDIT_TIME_MAX);
            d->value = d->value.toDate().startOfDay(d->timeZone);
        }
        d->updateEdit();
        d->editorCursorPositionChanged(-1, 0);
    }
}